

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

int __thiscall Order::clone(Order *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Order *this_00;
  
  this_00 = (Order *)operator_new(0x30);
  Order(this_00,this);
  return (int)this_00;
}

Assistant:

BaseAction *Order::clone() {
    return (new Order(*this));
}